

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

bool __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::final_deregister_coop
          (mt_env_infrastructure_t *this,string *coop_name)

{
  bool bVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)coop_name);
  bVar1 = coop_repo_t::final_deregister_coop(&this->m_coop_repo,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
mt_env_infrastructure_t::final_deregister_coop(
	std::string coop_name )
	{
		return m_coop_repo.final_deregister_coop( std::move(coop_name) );
	}